

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTDMT_initCStream(ZSTDMT_CCtx *mtctx,int compressionLevel)

{
  ZSTD_CCtx_params params_00;
  size_t sVar1;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  void *pvStack_d8;
  undefined1 local_d0 [4];
  undefined1 auStack_cc [4];
  ZSTD_CCtx_params cctxParams;
  ZSTD_parameters params;
  int compressionLevel_local;
  ZSTDMT_CCtx *mtctx_local;
  
  ZSTD_getParams((ZSTD_parameters *)((long)&cctxParams.customMem.opaque + 4),compressionLevel,
                 0xffffffffffffffff,0);
  memcpy(local_d0,&mtctx->params,0x90);
  _auStack_cc = stack0xffffffffffffffc4;
  memcpy(&local_160,local_d0,0x90);
  params_00.cParams.chainLog = (undefined4)uStack_158;
  params_00.cParams.hashLog = uStack_158._4_4_;
  params_00.format = (undefined4)local_160;
  params_00.cParams.windowLog = local_160._4_4_;
  params_00.cParams.searchLog = (undefined4)uStack_150;
  params_00.cParams.minMatch = uStack_150._4_4_;
  params_00.cParams.targetLength = (undefined4)uStack_148;
  params_00.cParams.strategy = uStack_148._4_4_;
  params_00.fParams.contentSizeFlag = (undefined4)local_140;
  params_00.fParams.checksumFlag = local_140._4_4_;
  params_00.fParams.noDictIDFlag = (undefined4)uStack_138;
  params_00.compressionLevel = uStack_138._4_4_;
  params_00._48_8_ = uStack_130;
  params_00.targetCBlockSize = uStack_128;
  params_00.srcSizeHint = (undefined4)local_120;
  params_00.attachDictPref = local_120._4_4_;
  params_00.literalCompressionMode = (undefined4)uStack_118;
  params_00.nbWorkers = uStack_118._4_4_;
  params_00.jobSize = uStack_110;
  params_00.overlapLog = (undefined4)uStack_108;
  params_00.rsyncable = uStack_108._4_4_;
  params_00.ldmParams.enableLdm = (undefined4)uStack_100;
  params_00.ldmParams.hashLog = uStack_100._4_4_;
  params_00.ldmParams.bucketSizeLog = (undefined4)uStack_f8;
  params_00.ldmParams.minMatchLength = uStack_f8._4_4_;
  params_00.ldmParams.hashRateLog = (undefined4)local_f0;
  params_00.ldmParams.windowLog = local_f0._4_4_;
  params_00.customMem.customAlloc = (ZSTD_allocFunction)uStack_e8;
  params_00.customMem.customFree = (ZSTD_freeFunction)uStack_e0;
  params_00.customMem.opaque = pvStack_d8;
  sVar1 = ZSTDMT_initCStream_internal
                    (mtctx,(void *)0x0,0,ZSTD_dct_auto,(ZSTD_CDict *)0x0,params_00,
                     0xffffffffffffffff);
  return sVar1;
}

Assistant:

size_t ZSTDMT_initCStream(ZSTDMT_CCtx* mtctx, int compressionLevel) {
    ZSTD_parameters const params = ZSTD_getParams(compressionLevel, ZSTD_CONTENTSIZE_UNKNOWN, 0);
    ZSTD_CCtx_params cctxParams = mtctx->params;   /* retrieve sticky params */
    DEBUGLOG(4, "ZSTDMT_initCStream (cLevel=%i)", compressionLevel);
    cctxParams.cParams = params.cParams;
    cctxParams.fParams = params.fParams;
    return ZSTDMT_initCStream_internal(mtctx, NULL, 0, ZSTD_dct_auto, NULL, cctxParams, ZSTD_CONTENTSIZE_UNKNOWN);
}